

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O2

unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>,_true> __thiscall
duckdb::SetDefaultInfo::Deserialize(SetDefaultInfo *this,Deserializer *deserializer)

{
  SetDefaultInfo *this_00;
  pointer pSVar1;
  _Head_base<0UL,_duckdb::SetDefaultInfo_*,_false> local_20;
  
  this_00 = (SetDefaultInfo *)operator_new(0xa0);
  SetDefaultInfo(this_00);
  local_20._M_head_impl = this_00;
  pSVar1 = unique_ptr<duckdb::SetDefaultInfo,_std::default_delete<duckdb::SetDefaultInfo>,_true>::
           operator->((unique_ptr<duckdb::SetDefaultInfo,_std::default_delete<duckdb::SetDefaultInfo>,_true>
                       *)&local_20);
  Deserializer::ReadPropertyWithDefault<std::__cxx11::string>
            (deserializer,400,"column_name",&pSVar1->column_name);
  pSVar1 = unique_ptr<duckdb::SetDefaultInfo,_std::default_delete<duckdb::SetDefaultInfo>,_true>::
           operator->((unique_ptr<duckdb::SetDefaultInfo,_std::default_delete<duckdb::SetDefaultInfo>,_true>
                       *)&local_20);
  Deserializer::
  ReadPropertyWithDefault<duckdb::unique_ptr<duckdb::ParsedExpression,std::default_delete<duckdb::ParsedExpression>,true>>
            (deserializer,0x191,"expression",&pSVar1->expression);
  (this->super_AlterTableInfo).super_AlterInfo.super_ParseInfo._vptr_ParseInfo =
       (_func_int **)local_20._M_head_impl;
  return (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)
         (unique_ptr<duckdb::AlterTableInfo,_std::default_delete<duckdb::AlterTableInfo>_>)this;
}

Assistant:

unique_ptr<AlterTableInfo> SetDefaultInfo::Deserialize(Deserializer &deserializer) {
	auto result = duckdb::unique_ptr<SetDefaultInfo>(new SetDefaultInfo());
	deserializer.ReadPropertyWithDefault<string>(400, "column_name", result->column_name);
	deserializer.ReadPropertyWithDefault<unique_ptr<ParsedExpression>>(401, "expression", result->expression);
	return std::move(result);
}